

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O2

void proto2_unittest::TestProto3Optional::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  MessageLite *pMVar4;
  MessageLite *pMVar5;
  char *failure_msg;
  void *pvVar6;
  int iVar7;
  Arena *pAVar8;
  Arena *arena;
  TestProto3Optional *_this;
  TestProto3Optional *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestProto3Optional *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestProto3Optional_const*,proto2_unittest::TestProto3Optional*>
                          ((TestProto3Optional **)local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((char)uVar1 != '\0') {
      if ((uVar1 & 1) != 0) {
        uVar2 = from_msg[1]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
        pAVar8 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.optional_string_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar8);
      }
      if ((uVar1 & 2) != 0) {
        pp_Var3 = from_msg[2]._vptr_MessageLite;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 2;
        pAVar8 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.optional_bytes_,
                   (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar8);
      }
      if ((uVar1 & 4) != 0) {
        uVar2 = from_msg[2]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 4;
        pAVar8 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.optional_cord_,(string *)(uVar2 & 0xfffffffffffffffc)
                   ,pAVar8);
      }
      if ((uVar1 & 8) != 0) {
        pMVar4 = (MessageLite *)from_msg[3]._vptr_MessageLite;
        if (pMVar4 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.optional_nested_message_ != nullptr";
          iVar7 = 0x4ca;
          goto LAB_00a78b3a;
        }
        pMVar5 = *(MessageLite **)((long)&local_30->field_0 + 0x20);
        if (pMVar5 == (MessageLite *)0x0) {
          pvVar6 = google::protobuf::Arena::
                   CopyConstruct<proto2_unittest::TestProto3Optional_NestedMessage>(arena,pMVar4);
          *(void **)((long)&local_30->field_0 + 0x20) = pvVar6;
        }
        else {
          TestProto3Optional_NestedMessage::MergeImpl(pMVar5,pMVar4);
        }
      }
      if ((uVar1 & 0x10) != 0) {
        pMVar4 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
        if (pMVar4 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.lazy_nested_message_ != nullptr";
          iVar7 = 0x4d2;
          goto LAB_00a78b3a;
        }
        pMVar5 = *(MessageLite **)((long)&local_30->field_0 + 0x28);
        if (pMVar5 == (MessageLite *)0x0) {
          pvVar6 = google::protobuf::Arena::
                   CopyConstruct<proto2_unittest::TestProto3Optional_NestedMessage>(arena,pMVar4);
          *(void **)((long)&local_30->field_0 + 0x28) = pvVar6;
        }
        else {
          TestProto3Optional_NestedMessage::MergeImpl(pMVar5,pMVar4);
        }
      }
      if ((uVar1 & 0x20) != 0) {
        *(_func_int ***)((long)&local_30->field_0 + 0x30) = from_msg[4]._vptr_MessageLite;
      }
      if ((uVar1 & 0x40) != 0) {
        *(int *)((long)&local_30->field_0 + 0x38) = (int)from_msg[4]._internal_metadata_.ptr_;
      }
      if ((char)uVar1 < '\0') {
        (local_30->field_0)._impl_.optional_uint32_ =
             *(uint32_t *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4);
      }
    }
    if ((uVar1 & 0xff00) != 0) {
      if ((uVar1 >> 8 & 1) != 0) {
        *(_func_int ***)((long)&local_30->field_0 + 0x40) = from_msg[5]._vptr_MessageLite;
      }
      if ((uVar1 >> 9 & 1) != 0) {
        *(intptr_t *)((long)&local_30->field_0 + 0x48) = from_msg[5]._internal_metadata_.ptr_;
      }
      if ((uVar1 >> 10 & 1) != 0) {
        *(undefined4 *)((long)&local_30->field_0 + 0x50) =
             *(undefined4 *)&from_msg[6]._vptr_MessageLite;
      }
      if ((uVar1 >> 0xb & 1) != 0) {
        (local_30->field_0)._impl_.optional_fixed32_ =
             *(uint32_t *)((long)&from_msg[6]._vptr_MessageLite + 4);
      }
      if ((uVar1 >> 0xc & 1) != 0) {
        *(intptr_t *)((long)&local_30->field_0 + 0x58) = from_msg[6]._internal_metadata_.ptr_;
      }
      if ((uVar1 >> 0xd & 1) != 0) {
        *(_func_int ***)((long)&local_30->field_0 + 0x60) = from_msg[7]._vptr_MessageLite;
      }
      if ((uVar1 >> 0xe & 1) != 0) {
        *(int *)((long)&local_30->field_0 + 0x68) = (int)from_msg[7]._internal_metadata_.ptr_;
      }
      if ((short)uVar1 < 0) {
        (local_30->field_0)._impl_.optional_float_ =
             *(float *)((long)&from_msg[7]._internal_metadata_.ptr_ + 4);
      }
    }
    if ((uVar1 & 0x1f0000) != 0) {
      if ((uVar1 >> 0x10 & 1) != 0) {
        *(_func_int ***)((long)&local_30->field_0 + 0x70) = from_msg[8]._vptr_MessageLite;
      }
      if ((uVar1 >> 0x11 & 1) != 0) {
        *(char *)((long)&local_30->field_0 + 0x78) = (char)from_msg[8]._internal_metadata_.ptr_;
      }
      if ((uVar1 >> 0x12 & 1) != 0) {
        (local_30->field_0)._impl_.optional_nested_enum_ =
             *(int *)((long)&from_msg[8]._internal_metadata_.ptr_ + 4);
      }
      if (((uVar1 >> 0x13 & 1) != 0) && (from_msg[9]._vptr_MessageLite != (_func_int **)0x0)) {
        *(_func_int ***)((long)&local_30->field_0 + 0x80) = from_msg[9]._vptr_MessageLite;
      }
      if (((uVar1 >> 0x14 & 1) != 0) &&
         (iVar7 = (int)from_msg[9]._internal_metadata_.ptr_, iVar7 != 0)) {
        *(int *)((long)&local_30->field_0 + 0x88) = iVar7;
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  iVar7 = 0x4ba;
LAB_00a78b3a:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_proto3_optional.pb.cc"
             ,iVar7,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void TestProto3Optional::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestProto3Optional*>(&to_msg);
  auto& from = static_cast<const TestProto3Optional&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestProto3Optional)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_optional_cord(from._internal_optional_cord());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.lazy_nested_message_ != nullptr);
      if (_this->_impl_.lazy_nested_message_ == nullptr) {
        _this->_impl_.lazy_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.lazy_nested_message_);
      } else {
        _this->_impl_.lazy_nested_message_->MergeFrom(*from._impl_.lazy_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.optional_float_ = from._impl_.optional_float_;
    }
  }
  if ((cached_has_bits & 0x001f0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.optional_double_ = from._impl_.optional_double_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_singular_int64() != 0) {
        _this->_impl_.singular_int64_ = from._impl_.singular_int64_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_singular_int32() != 0) {
        _this->_impl_.singular_int32_ = from._impl_.singular_int32_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}